

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  bool bVar1;
  reference pvVar2;
  string *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  FilePath result;
  FilePath *in_stack_ffffffffffffff58;
  string *pathname;
  FilePath *in_stack_ffffffffffffff70;
  FilePath *in_stack_ffffffffffffff80;
  FilePath *in_stack_ffffffffffffffb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40 [2];
  
  pathname = in_RDI;
  FilePath::FilePath(in_stack_ffffffffffffff80);
  GetArgvs_abi_cxx11_();
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff70);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_40,0);
    std::__cxx11::string::string((string *)&stack0xffffffffffffff70,(string *)pvVar2);
    FilePath::FilePath(in_stack_ffffffffffffff70,pathname);
    FilePath::Set((FilePath *)in_RDI,in_stack_ffffffffffffff58);
    FilePath::~FilePath((FilePath *)0x1e0533);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  }
  FilePath::RemoveDirectoryName(in_stack_ffffffffffffffb8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff70);
  FilePath::~FilePath((FilePath *)0x1e05c1);
  return (FilePath *)pathname;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

  auto args = GetArgvs();
  if (!args.empty()) {
#if defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_OS2)
    result.Set(FilePath(args[0]).RemoveExtension("exe"));
#else
    result.Set(FilePath(args[0]));
#endif  // GTEST_OS_WINDOWS
  }

  return result.RemoveDirectoryName();
}